

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_usage(char *name,char *help,zt_opt_def_t *opts)

{
  int iVar1;
  long in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  int i;
  zt_opt_def_t *in_stack_00000048;
  char *local_38;
  int local_24;
  
  local_38 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_38 = "";
  }
  printf("Usage: %s %s\nOptions:\n",in_RDI,local_38);
  local_24 = 0;
  while( true ) {
    if (*(long *)(in_RDX + (long)local_24 * 0x30 + 0x18) == 0) {
      return 0;
    }
    iVar1 = _zt_opt_help_stdout_printer(in_stack_00000048);
    if (iVar1 < 0) break;
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int
zt_opt_usage(const char * name, const char * help, zt_opt_def_t * opts) {
    int i;

    printf("Usage: %s %s\nOptions:\n", name, help ? help : "");

    for (i = 0; opts[i].cb != NULL; i++) {
        if (_zt_opt_help_stdout_printer(&opts[i]) < 0) {
            return -1;
        }
    }

    return 0;
}